

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp_mask_pred_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_10ab78d::AV1HighbdUpsampledPredTest_CheckOutput_Test::TestBody
          (AV1HighbdUpsampledPredTest_CheckOutput_Test *this)

{
  BLOCK_SIZE_conflict in_stack_000000cf;
  highbd_upsampled_pred_func in_stack_000000d0;
  AV1HighbdUpsampledPredTest *in_stack_000000d8;
  
  testing::
  WithParamInterface<std::tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int,_int),_BLOCK_SIZE,_int>_>
  ::GetParam();
  std::
  get<0ul,void(*)(macroblockd*,AV1Common_const*,int,int,mv_const*,unsigned_char*,int,int,int,int,unsigned_char_const*,int,int,int),BLOCK_SIZE,int>
            ((tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int,_int),_BLOCK_SIZE,_int>
              *)0xab351f);
  testing::
  WithParamInterface<std::tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int,_int),_BLOCK_SIZE,_int>_>
  ::GetParam();
  std::
  get<1ul,void(*)(macroblockd*,AV1Common_const*,int,int,mv_const*,unsigned_char*,int,int,int,int,unsigned_char_const*,int,int,int),BLOCK_SIZE,int>
            ((tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int,_int),_BLOCK_SIZE,_int>
              *)0xab3534);
  AV1HighbdUpsampledPredTest::RunCheckOutput(in_stack_000000d8,in_stack_000000d0,in_stack_000000cf);
  return;
}

Assistant:

TEST_P(AV1HighbdUpsampledPredTest, CheckOutput) {
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1));
}